

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames_impl.cpp
# Opt level: O1

UnicodeString * __thiscall
icu_63::TimeZoneNamesImpl::getMetaZoneDisplayName
          (TimeZoneNamesImpl *this,UnicodeString *mzID,UTimeZoneNameType type,UnicodeString *name)

{
  UErrorCode UVar1;
  UTimeZoneNameTypeIndex UVar2;
  ZNames *pZVar3;
  UErrorCode status;
  UErrorCode local_3c;
  ConstChar16Ptr local_38 [3];
  
  UnicodeString::setToBogus(name);
  if (0x1f < (ushort)(mzID->fUnion).fStackFields.fLengthAndFlags) {
    umtx_lock_63((UMutex *)gDataMutex);
    local_3c = U_ZERO_ERROR;
    pZVar3 = loadMetaZoneNames(this,mzID,&local_3c);
    UVar1 = local_3c;
    umtx_unlock_63((UMutex *)gDataMutex);
    if ((pZVar3 != (ZNames *)0x0) && (UVar1 < U_ILLEGAL_ARGUMENT_ERROR)) {
      UVar2 = ZNames::getTZNameTypeIndex(type);
      if (UVar2 < UTZNM_INDEX_EXEMPLAR_LOCATION) {
        local_38[0].p_ = (UChar *)0x0;
      }
      else {
        local_38[0].p_ = pZVar3->fNames[(uint)UVar2];
      }
      if (local_38[0].p_ != (UChar *)0x0) {
        UnicodeString::setTo(name,'\x01',local_38,-1);
      }
    }
  }
  return name;
}

Assistant:

UnicodeString&
TimeZoneNamesImpl::getMetaZoneDisplayName(const UnicodeString& mzID,
                                          UTimeZoneNameType type,
                                          UnicodeString& name) const {
    name.setToBogus();  // cleanup result.
    if (mzID.isEmpty()) {
        return name;
    }

    ZNames *znames = NULL;
    TimeZoneNamesImpl *nonConstThis = const_cast<TimeZoneNamesImpl *>(this);

    {
        Mutex lock(&gDataMutex);
        UErrorCode status = U_ZERO_ERROR;
        znames = nonConstThis->loadMetaZoneNames(mzID, status);
        if (U_FAILURE(status)) { return name; }
    }

    if (znames != NULL) {
        const UChar* s = znames->getName(type);
        if (s != NULL) {
            name.setTo(TRUE, s, -1);
        }
    }
    return name;
}